

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compactor.cc
# Opt level: O2

fdb_status
compactor_get_actual_filename
          (char *filename,char *actual_filename,fdb_compaction_mode_t comp_mode,
          err_log_callback *log_callback)

{
  ulong uVar1;
  long lVar2;
  bool bVar3;
  int iVar4;
  compactor_meta *pcVar5;
  size_t sVar6;
  ulong uVar7;
  DIR *__dirp;
  dirent *pdVar8;
  uint uVar9;
  undefined7 in_register_00000011;
  err_log_callback *log_callback_00;
  uint uVar10;
  int compaction_no;
  undefined4 local_1454;
  char *local_1450;
  char dirname [1024];
  char ret_name [1024];
  char prefix [1024];
  compactor_meta meta;
  char path [1024];
  
  sprintf(path,"%s.meta",filename);
  pcVar5 = _compactor_read_metafile(path,&meta,log_callback_00);
  if (pcVar5 == (compactor_meta *)0x0) {
    if ((comp_mode == '\0') && (bVar3 = does_file_exist(filename), bVar3)) goto LAB_0010e344;
    sVar6 = strlen(filename);
    local_1454 = (undefined4)CONCAT71(in_register_00000011,comp_mode);
    uVar7 = sVar6 & 0xffffffff;
    do {
      if ((int)uVar7 < 1) {
        dirname[0] = '.';
        dirname[1] = '\0';
        uVar7 = 0;
        goto LAB_0010e3c1;
      }
      uVar1 = uVar7 - 1;
      lVar2 = uVar7 - 1;
      uVar7 = uVar1;
    } while (filename[lVar2] != '/');
    uVar7 = (ulong)((int)uVar1 + 1U & 0x7fffffff);
    strncpy(dirname,filename,uVar7);
    dirname[uVar7] = '\0';
LAB_0010e3c1:
    strcpy(prefix,filename + uVar7);
    sVar6 = strlen(prefix);
    (prefix + sVar6)[0] = '.';
    (prefix + sVar6)[1] = '\0';
    __dirp = opendir(dirname);
    if (__dirp != (DIR *)0x0) {
      local_1450 = actual_filename;
      uVar10 = 0xffffffff;
      while (pdVar8 = readdir(__dirp), pdVar8 != (dirent *)0x0) {
        sVar6 = strlen(prefix);
        iVar4 = strncmp(pdVar8->d_name,prefix,sVar6);
        if (iVar4 == 0) {
          compaction_no = -1;
          __isoc99_sscanf(pdVar8->d_name + sVar6,"%d",&compaction_no);
          uVar9 = uVar10;
          if ((int)uVar10 < compaction_no) {
            uVar9 = compaction_no;
          }
          if (-1 < compaction_no) {
            uVar10 = uVar9;
          }
        }
      }
      closedir(__dirp);
      actual_filename = local_1450;
      if (-1 < (int)uVar10) {
        sprintf(ret_name,"%s.%d",filename,(ulong)uVar10);
        goto LAB_0010e341;
      }
    }
    if ((char)local_1454 != '\x01') goto LAB_0010e344;
    sprintf(ret_name,"%s.0",filename);
  }
  else {
    _reconstruct_path(ret_name,filename,meta.filename);
  }
LAB_0010e341:
  filename = ret_name;
LAB_0010e344:
  strcpy(actual_filename,filename);
  return FDB_RESULT_SUCCESS;
}

Assistant:

fdb_status compactor_get_actual_filename(const char *filename,
                                         char *actual_filename,
                                         fdb_compaction_mode_t comp_mode,
                                         err_log_callback *log_callback)
{
    int i;
    int filename_len;
    int dirname_len;
    int compaction_no, max_compaction_no = -1;
    char path[MAX_FNAMELEN];
    char dirname[MAX_FNAMELEN], prefix[MAX_FNAMELEN];
    char ret_name[MAX_FNAMELEN];
    fdb_status fs = FDB_RESULT_SUCCESS;
    struct compactor_meta meta, *meta_ptr;

    // get actual filename from metafile
    sprintf(path, "%s.meta", filename);
    meta_ptr = _compactor_read_metafile(path, &meta, log_callback);

    if (meta_ptr == NULL) {
        if (comp_mode == FDB_COMPACTION_MANUAL && does_file_exist(filename)) {
            strcpy(actual_filename, filename);
            return FDB_RESULT_SUCCESS;
        }

        // error handling .. scan directory
        // backward search until find the first '/' or '\' (Windows)
        filename_len = strlen(filename);
        dirname_len = 0;

#if !defined(WIN32) && !defined(_WIN32)
        DIR *dir_info;
        struct dirent *dir_entry;

        for (i=filename_len-1; i>=0; --i){
            if (filename[i] == '/') {
                dirname_len = i+1;
                break;
            }
        }

        if (dirname_len > 0) {
            strncpy(dirname, filename, dirname_len);
            dirname[dirname_len] = 0;
        } else {
            strcpy(dirname, ".");
        }
        strcpy(prefix, filename + dirname_len);
        strcat(prefix, ".");

        dir_info = opendir(dirname);
        if (dir_info != NULL) {
            while ((dir_entry = readdir(dir_info))) {
                if (!strncmp(dir_entry->d_name, prefix, strlen(prefix))) {
                    compaction_no = -1;
                    sscanf(dir_entry->d_name + strlen(prefix), "%d", &compaction_no);
                    if (compaction_no >= 0) {
                        if (compaction_no > max_compaction_no) {
                            max_compaction_no = compaction_no;
                        }
                    }
                }
            }
            closedir(dir_info);
        }
#else
        // Windows
        for (i=filename_len-1; i>=0; --i){
            if (filename[i] == '/' || filename[i] == '\\') {
                dirname_len = i+1;
                break;
            }
        }

        if (dirname_len > 0) {
            strncpy(dirname, filename, dirname_len);
            dirname[dirname_len] = 0;
        } else {
            strcpy(dirname, ".");
        }
        strcpy(prefix, filename + dirname_len);
        strcat(prefix, ".");

        WIN32_FIND_DATA filedata;
        HANDLE hfind;
        char query_str[MAX_FNAMELEN];

        // find all files start with 'prefix'
        sprintf(query_str, "%s*", prefix);
        hfind = FindFirstFile(query_str, &filedata);
        while (hfind != INVALID_HANDLE_VALUE) {
            if (!strncmp(filedata.cFileName, prefix, strlen(prefix))) {
                compaction_no = -1;
                sscanf(filedata.cFileName + strlen(prefix), "%d", &compaction_no);
                if (compaction_no >= 0) {
                    if (compaction_no > max_compaction_no) {
                        max_compaction_no = compaction_no;
                    }
                }
            }

            if (!FindNextFile(hfind, &filedata)) {
                FindClose(hfind);
                hfind = INVALID_HANDLE_VALUE;
            }
        }

#endif

        if (max_compaction_no < 0) {
            if (comp_mode == FDB_COMPACTION_AUTO) {
                // DB files with a revision number are not found.
                // initialize filename to '[filename].0'
                sprintf(ret_name, "%s.0", filename);
            } else { // Manual compaction mode.
                // Simply use the file name passed to this function.
                strcpy(actual_filename, filename);
                return FDB_RESULT_SUCCESS;
            }
        } else {
            // return the file that has the largest compaction number
            sprintf(ret_name, "%s.%d", filename, max_compaction_no);
            fs = FDB_RESULT_SUCCESS;
        }
        if (fs == FDB_RESULT_SUCCESS) {
            strcpy(actual_filename, ret_name);
        }
        return fs;

    } else {
        // metadata is successfully read from the metafile .. just return the filename
        _reconstruct_path(ret_name, (char*)filename, meta.filename);
        strcpy(actual_filename, ret_name);
        return FDB_RESULT_SUCCESS;
    }
}